

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O0

int Cudd_CheckKeys(DdManager *table)

{
  uint uVar1;
  DdNode **ppDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DdSubtable *pDVar6;
  byte bVar7;
  int shift;
  int logSlots;
  uint slots;
  int nonEmpty;
  int totalDead;
  int totalSlots;
  int totalKeys;
  int count;
  int dead;
  int keys;
  DdSubtable *subtable;
  DdNode *sentinel;
  DdNode *node;
  DdNodePtr *nodelist;
  uint local_18;
  int j;
  int i;
  int size;
  DdManager *table_local;
  
  totalSlots = 0;
  totalDead = 0;
  nonEmpty = 0;
  slots = 0;
  logSlots = 0;
  iVar3 = table->size;
  for (local_18 = 0; (int)local_18 < iVar3; local_18 = local_18 + 1) {
    pDVar6 = table->subtables + (int)local_18;
    ppDVar2 = pDVar6->nodelist;
    count = pDVar6->keys;
    totalKeys = pDVar6->dead;
    totalDead = count + totalDead;
    uVar4 = pDVar6->slots;
    uVar1 = pDVar6->shift;
    bVar7 = 0x20 - (char)uVar1;
    if ((uVar4 >> (bVar7 & 0x1f)) << (bVar7 & 0x1f) != uVar4) {
      fprintf((FILE *)table->err,"Unique table %d is not the right power of 2\n",(ulong)local_18);
      fprintf((FILE *)table->err,"    slots = %u shift = %d\n",(ulong)uVar4,(ulong)uVar1);
    }
    nonEmpty = uVar4 + nonEmpty;
    slots = totalKeys + slots;
    for (nodelist._4_4_ = 0; nodelist._4_4_ < uVar4; nodelist._4_4_ = nodelist._4_4_ + 1) {
      sentinel = ppDVar2[(int)nodelist._4_4_];
      if ((DdManager *)sentinel != table) {
        logSlots = logSlots + 1;
      }
      for (; (DdManager *)sentinel != table; sentinel = sentinel->next) {
        count = count + -1;
        if (sentinel->ref == 0) {
          totalKeys = totalKeys + -1;
        }
      }
    }
    if (count != 0) {
      fprintf((FILE *)table->err,"Wrong number of keys found in unique table %d (difference=%d)\n",
              (ulong)local_18,(ulong)(uint)count);
      totalSlots = totalSlots + 1;
    }
    if (totalKeys != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of dead found in unique table no. %d (difference=%d)\n",(ulong)local_18,
              (ulong)(uint)totalKeys);
    }
  }
  iVar3 = table->sizeZ;
  for (local_18 = 0; (int)local_18 < iVar3; local_18 = local_18 + 1) {
    pDVar6 = table->subtableZ + (int)local_18;
    count = pDVar6->keys;
    totalKeys = pDVar6->dead;
    totalDead = count + totalDead;
    nonEmpty = pDVar6->slots + nonEmpty;
    slots = totalKeys + slots;
    for (nodelist._4_4_ = 0; nodelist._4_4_ < pDVar6->slots; nodelist._4_4_ = nodelist._4_4_ + 1) {
      sentinel = pDVar6->nodelist[(int)nodelist._4_4_];
      if (sentinel != (DdNode *)0x0) {
        logSlots = logSlots + 1;
      }
      for (; sentinel != (DdNode *)0x0; sentinel = sentinel->next) {
        count = count + -1;
        if (sentinel->ref == 0) {
          totalKeys = totalKeys + -1;
        }
      }
    }
    if (count != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of keys found in ZDD unique table no. %d (difference=%d)\n",
              (ulong)local_18,(ulong)(uint)count);
      totalSlots = totalSlots + 1;
    }
    if (totalKeys != 0) {
      fprintf((FILE *)table->err,
              "Wrong number of dead found in ZDD unique table no. %d (difference=%d)\n",
              (ulong)local_18,(ulong)(uint)totalKeys);
    }
  }
  count = (table->constants).keys;
  totalKeys = (table->constants).dead;
  iVar3 = count + totalDead;
  uVar4 = (table->constants).slots + nonEmpty;
  iVar5 = totalKeys + slots;
  for (nodelist._4_4_ = 0; nodelist._4_4_ < (table->constants).slots;
      nodelist._4_4_ = nodelist._4_4_ + 1) {
    sentinel = (table->constants).nodelist[(int)nodelist._4_4_];
    if (sentinel != (DdNode *)0x0) {
      logSlots = logSlots + 1;
    }
    for (; sentinel != (DdNode *)0x0; sentinel = sentinel->next) {
      count = count + -1;
      if (sentinel->ref == 0) {
        totalKeys = totalKeys + -1;
      }
    }
  }
  if (count != 0) {
    fprintf((FILE *)table->err,"Wrong number of keys found in the constant table (difference=%d)\n",
            (ulong)(uint)count);
    totalSlots = totalSlots + 1;
  }
  if (totalKeys != 0) {
    fprintf((FILE *)table->err,"Wrong number of dead found in the constant table (difference=%d)\n",
            (ulong)(uint)totalKeys);
  }
  if (iVar3 != table->keys + table->keysZ) {
    fprintf((FILE *)table->err,"Wrong number of total keys found (difference=%d)\n",
            (ulong)(iVar3 - table->keys));
  }
  if (uVar4 != table->slots) {
    fprintf((FILE *)table->err,"Wrong number of total slots found (difference=%d)\n",
            (ulong)(uVar4 - table->slots));
  }
  if (table->minDead != (uint)(long)(table->gcFrac * (double)table->slots)) {
    fprintf((FILE *)table->err,"Wrong number of minimum dead found (%u vs. %u)\n",
            (ulong)table->minDead,(long)(table->gcFrac * (double)table->slots) & 0xffffffff);
  }
  if (iVar5 != table->dead + table->deadZ) {
    fprintf((FILE *)table->err,"Wrong number of total dead found (difference=%d)\n",
            (ulong)(iVar5 - table->dead));
  }
  printf("Average length of non-empty lists = %g\n",(double)table->keys / (double)logSlots);
  return totalSlots;
}

Assistant:

int
Cudd_CheckKeys(
  DdManager * table)
{
    int size;
    int i,j;
    DdNodePtr *nodelist;
    DdNode *node;
    DdNode *sentinel = &(table->sentinel);
    DdSubtable *subtable;
    int keys;
    int dead;
    int count = 0;
    int totalKeys = 0;
    int totalSlots = 0;
    int totalDead = 0;
    int nonEmpty = 0;
    unsigned int slots;
    int logSlots;
    int shift;

    size = table->size;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtables[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        slots = subtable->slots;
        shift = subtable->shift;
        logSlots = sizeof(int) * 8 - shift;
        if (((slots >> logSlots) << logSlots) != slots) {
            (void) fprintf(table->err,
                           "Unique table %d is not the right power of 2\n", i);
            (void) fprintf(table->err,
                           "    slots = %u shift = %d\n", slots, shift);
        }
        totalSlots += slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < slots; j++) {
            node = nodelist[j];
            if (node != sentinel) {
                nonEmpty++;
            }
            while (node != sentinel) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in unique table %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    size = table->sizeZ;

    for (i = 0; i < size; i++) {
        subtable = &(table->subtableZ[i]);
        nodelist = subtable->nodelist;
        keys = subtable->keys;
        dead = subtable->dead;
        totalKeys += keys;
        totalSlots += subtable->slots;
        totalDead += dead;
        for (j = 0; (unsigned) j < subtable->slots; j++) {
            node = nodelist[j];
            if (node != NULL) {
                nonEmpty++;
            }
            while (node != NULL) {
                keys--;
                if (node->ref == 0) {
                    dead--;
                }
                node = node->next;
            }
        }
        if (keys != 0) {
            (void) fprintf(table->err, "Wrong number of keys found \
in ZDD unique table no. %d (difference=%d)\n", i, keys);
            count++;
        }
        if (dead != 0) {
            (void) fprintf(table->err, "Wrong number of dead found \
in ZDD unique table no. %d (difference=%d)\n", i, dead);
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    subtable = &(table->constants);
    nodelist = subtable->nodelist;
    keys = subtable->keys;
    dead = subtable->dead;
    totalKeys += keys;
    totalSlots += subtable->slots;
    totalDead += dead;
    for (j = 0; (unsigned) j < subtable->slots; j++) {
        node = nodelist[j];
        if (node != NULL) {
            nonEmpty++;
        }
        while (node != NULL) {
            keys--;
            if (node->ref == 0) {
                dead--;
            }
            node = node->next;
        }
    }
    if (keys != 0) {
        (void) fprintf(table->err, "Wrong number of keys found \
in the constant table (difference=%d)\n", keys);
        count++;
    }
    if (dead != 0) {
        (void) fprintf(table->err, "Wrong number of dead found \
in the constant table (difference=%d)\n", dead);
    }
    if ((unsigned) totalKeys != table->keys + table->keysZ) {
        (void) fprintf(table->err, "Wrong number of total keys found \
(difference=%d)\n", (int) (totalKeys-table->keys));
    }
    if ((unsigned) totalSlots != table->slots) {
        (void) fprintf(table->err, "Wrong number of total slots found \
(difference=%d)\n", (int) (totalSlots-table->slots));
    }
    if (table->minDead != (unsigned) (table->gcFrac * table->slots)) {
        (void) fprintf(table->err, "Wrong number of minimum dead found \
(%u vs. %u)\n", table->minDead,
        (unsigned) (table->gcFrac * (double) table->slots));
    }
    if ((unsigned) totalDead != table->dead + table->deadZ) {
        (void) fprintf(table->err, "Wrong number of total dead found \
(difference=%d)\n", (int) (totalDead-table->dead));
    }
    (void)printf("Average length of non-empty lists = %g\n",
    (double) table->keys / (double) nonEmpty);

    return(count);

}